

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Maj3_ManAddCnf(Maj3_Man_t *p,int iMint)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  int iVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  int *piVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int pLits [5];
  int local_98 [6];
  int *local_80;
  int *local_78;
  int (*local_70) [32];
  int *local_68;
  ulong local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  int (*local_40) [32];
  long local_38;
  
  auVar26 = _DAT_0093d220;
  iVar6 = p->nVars;
  lVar7 = (long)iVar6;
  if (0 < lVar7) {
    lVar8 = lVar7 + -1;
    auVar18._8_4_ = (int)lVar8;
    auVar18._0_8_ = lVar8;
    auVar18._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar12 = 0;
    auVar18 = auVar18 ^ _DAT_0093d220;
    auVar21 = _DAT_0093d210;
    do {
      auVar23 = auVar21 ^ auVar26;
      if ((bool)(~(auVar23._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar23._0_4_ ||
                  auVar18._4_4_ < auVar23._4_4_) & 1)) {
        p->ObjVals[uVar12] = (uint)(((uint)iMint >> ((uint)uVar12 & 0x1f) & 1) != 0);
      }
      if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
          auVar23._12_4_ <= auVar18._12_4_) {
        p->ObjVals[uVar12 + 1] = (uint)(((uint)iMint >> ((uint)uVar12 + 1 & 0x1f) & 1) != 0);
      }
      uVar12 = uVar12 + 2;
      lVar8 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar8 + 2;
    } while ((iVar6 + 1U & 0xfffffffe) != uVar12);
  }
  if (p->ObjVals[0] == 0) {
    if (p->ObjVals[1] == 0) {
      uVar10 = 0;
      goto LAB_005ad4db;
    }
  }
  else {
    uVar10 = 1;
    if (p->ObjVals[1] != 0) goto LAB_005ad4db;
  }
  uVar10 = (uint)(p->ObjVals[2] != 0);
LAB_005ad4db:
  p->ObjVals[lVar7] = uVar10;
  iVar6 = p->nVars;
  if (iVar6 < 1) {
    iVar20 = 0;
  }
  else {
    uVar10 = iVar6 + 3U & 0xfffffffc;
    iVar20 = iVar6 + -1;
    auVar19._4_4_ = iVar20;
    auVar19._0_4_ = iVar20;
    auVar19._8_4_ = iVar20;
    auVar19._12_4_ = iVar20;
    auVar22._4_4_ = iMint;
    auVar22._0_4_ = iMint;
    auVar22._8_4_ = iMint;
    auVar22._12_4_ = iMint;
    auVar26 = (undefined1  [16])0x0;
    auVar23 = _DAT_0094a000;
    do {
      auVar21 = auVar23;
      auVar18 = auVar26;
      auVar23 = pshuflw(auVar18,auVar21,0xfe);
      auVar25 = pshuflw(in_XMM9,auVar21,0x54);
      auVar24._0_8_ = auVar21._8_8_;
      auVar24._8_4_ = auVar21._8_4_;
      auVar24._12_4_ = auVar21._12_4_;
      auVar26 = pshuflw(auVar25,auVar24,0xfe);
      lVar7 = auVar26._0_8_;
      auVar4._4_8_ = auVar22._8_8_;
      auVar4._0_4_ = (uint)iMint >> lVar7;
      auVar28._0_8_ = auVar4._0_8_ << 0x20;
      auVar28._8_4_ = (uint)iMint >> lVar7;
      auVar28._12_4_ = (uint)iMint >> lVar7;
      auVar26 = pshuflw(auVar24,auVar24,0x54);
      lVar7 = auVar26._0_8_;
      auVar5._4_8_ = auVar22._8_8_;
      auVar5._0_4_ = (uint)iMint >> lVar7;
      auVar27._0_8_ = auVar5._0_8_ << 0x20;
      auVar27._8_4_ = (uint)iMint >> lVar7;
      auVar27._12_4_ = (uint)iMint >> lVar7;
      in_XMM9._8_8_ = auVar28._8_8_;
      in_XMM9._0_8_ = auVar27._8_8_;
      auVar26._0_4_ = ((uint)iMint >> auVar25._0_8_ & 1) + auVar18._0_4_;
      auVar26._4_4_ = ((uint)iMint >> auVar23._0_8_ & 1) + auVar18._4_4_;
      auVar26._8_4_ = (auVar27._8_4_ & 1) + auVar18._8_4_;
      auVar26._12_4_ = (auVar28._12_4_ & 1) + auVar18._12_4_;
      auVar23._0_4_ = auVar21._0_4_ + 4;
      auVar23._4_4_ = auVar21._4_4_ + 4;
      auVar23._8_4_ = auVar21._8_4_ + 4;
      auVar23._12_4_ = auVar21._12_4_ + 4;
      uVar10 = uVar10 - 4;
    } while (uVar10 != 0);
    auVar19 = auVar19 ^ _DAT_0093d220;
    auVar21 = auVar21 ^ _DAT_0093d220;
    auVar25._0_4_ = -(uint)(auVar19._0_4_ < auVar21._0_4_);
    auVar25._4_4_ = -(uint)(auVar19._4_4_ < auVar21._4_4_);
    auVar25._8_4_ = -(uint)(auVar19._8_4_ < auVar21._8_4_);
    auVar25._12_4_ = -(uint)(auVar19._12_4_ < auVar21._12_4_);
    auVar26 = ~auVar25 & auVar26 | auVar18 & auVar25;
    iVar20 = auVar26._12_4_ + auVar26._4_4_ + auVar26._8_4_ + auVar26._0_4_;
  }
  p->ObjVals[(long)p->nObjs + -1] = (uint)(iVar6 / 2 < iVar20);
  if (p->nVars + 1 < p->nObjs + -1) {
    lVar7 = (long)p->nVars + 0x40b;
    do {
      iVar6 = p->iVar;
      p->iVar = iVar6 + 1;
      *(int *)((long)(p->VarMarks + -1) + 0x58 + lVar7 * 4) = iVar6;
      lVar8 = lVar7 + -0x409;
      lVar7 = lVar7 + 1;
    } while (lVar8 < (long)p->nObjs + -1);
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->iVar);
  local_70 = p->VarMarks;
  iVar6 = p->nObjs;
  local_78 = p->ObjVals + 1;
  local_80 = p->VarMarks[1] + 1;
  uVar10 = 0;
  bVar9 = true;
  do {
    iVar20 = p->nVars;
    if (iVar20 + 1 < iVar6) {
      uVar17 = uVar10 ^ 1;
      lVar7 = (long)iVar20 + 1;
      piVar16 = local_80 + (long)iVar20 * 0x20;
      do {
        local_68 = piVar16;
        if (0 < iVar6) {
          iVar20 = 1;
          local_40 = local_70 + lVar7;
          local_38 = 0;
          piVar15 = local_78;
          do {
            iVar1 = (*local_40)[local_38];
            if ((0 < iVar1) && (uVar2 = p->ObjVals[local_38], uVar2 != uVar17)) {
              bVar3 = 1 < (int)uVar2;
              if (bVar3) {
                local_98[0] = uVar10 + uVar2 * 2;
              }
              uVar12 = (ulong)bVar3;
              if (iVar1 != 1) {
                uVar12 = (ulong)(bVar3 + 1);
                local_98[bVar3] = iVar1 * 2 + 1;
              }
              if (local_38 + 1 < (long)iVar6) {
                iVar1 = (int)uVar12;
                lVar8 = 0;
                local_60 = uVar12;
                local_58 = piVar15;
                local_50 = piVar16;
                local_48 = uVar12;
                do {
                  iVar11 = piVar16[lVar8];
                  if ((0 < iVar11) && (uVar2 = piVar15[lVar8], uVar2 != uVar17)) {
                    uVar13 = uVar12 & 0xffffffff;
                    if (1 < (int)uVar2) {
                      local_98[local_48] = uVar10 + uVar2 * 2;
                      uVar13 = (ulong)(iVar1 + 1);
                    }
                    uVar14 = uVar13;
                    if (iVar11 != 1) {
                      uVar14 = (ulong)((int)uVar13 + 1);
                      local_98[uVar13] = iVar11 * 2 + 1;
                    }
                    iVar11 = (int)uVar14;
                    uVar2 = p->ObjVals[lVar7];
                    if (uVar2 != uVar10) {
                      if (1 < (int)uVar2) {
                        iVar11 = iVar11 + 1;
                        local_98[uVar14] = uVar17 + uVar2 * 2;
                      }
                      if (4 < iVar11 - 1U) {
                        __assert_fail("nLits2 > 0 && nLits2 <= 5",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                                      ,0x16f,"int Maj3_ManAddCnf(Maj3_Man_t *, int)");
                      }
                      iVar6 = bmcg_sat_solver_addclause(p->pSat,local_98,iVar11);
                      if (iVar6 == 0) {
                        return 0;
                      }
                      iVar6 = p->nObjs;
                      piVar15 = local_58;
                      piVar16 = local_50;
                      uVar12 = local_60;
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while ((int)lVar8 + iVar20 < iVar6);
              }
            }
            local_38 = local_38 + 1;
            iVar20 = iVar20 + 1;
            piVar15 = piVar15 + 1;
            piVar16 = piVar16 + 1;
          } while (local_38 < iVar6);
        }
        lVar7 = lVar7 + 1;
        piVar16 = local_68 + 0x20;
      } while (lVar7 < iVar6);
    }
    uVar10 = 1;
    bVar3 = !bVar9;
    bVar9 = false;
    if (bVar3) {
      return 1;
    }
  } while( true );
}

Assistant:

int Maj3_ManAddCnf( Maj3_Man_t * p, int iMint )
{
    // input values
    int i, k, j, n, * pVals = p->ObjVals;
    for ( i = 0; i < p->nVars; i++ )
        pVals[i] = (iMint >> i) & 1;
    // first node value
    pVals[p->nVars] = (pVals[0] && pVals[1]) || (pVals[0] && pVals[2]) || (pVals[1] && pVals[2]);
    // last node value
    pVals[p->nObjs-1] = Maj3_ManValue(iMint, p->nVars);
    // intermediate node values
    for ( i = p->nVars + 1; i < p->nObjs - 1; i++ )
        pVals[i] = p->iVar++;
    //printf( "Adding clauses for minterm %d.\n", iMint );
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    for ( n = 0; n < 2; n++ )
    for ( i = p->nVars + 1; i < p->nObjs; i++ )
    {
        //printf( "\nNode %d. Phase %d.\n", i, n );
        for ( k = 0; k < p->nObjs; k++ ) if ( p->VarMarks[i][k] >= 1 )
        {
            // add first input
            int pLits[5], nLits = 0;
            if ( pVals[k] == !n )
                continue;
            if ( pVals[k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( pVals[k], n );
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 1 );
            for ( j = k+1; j < p->nObjs; j++ ) if ( p->VarMarks[i][j] >= 1 )
            {
                // add second input
                int nLits2 = nLits;
                if ( pVals[j] == !n )
                    continue;
                if ( pVals[j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[j], n );
                if ( p->VarMarks[i][j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( p->VarMarks[i][j], 1 );
                // add output
                if ( pVals[i] == n )
                    continue;
                if ( pVals[i] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[i], !n );
                assert( nLits2 > 0 && nLits2 <= 5 );
                //Maj3_PrintClause( pLits, nLits2 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits2 ) )
                    return 0;
            }
        }
    }
    return 1;
}